

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 4.c
# Opt level: O0

int main(void)

{
  int step;
  int upper;
  int lower;
  float celcius;
  float fahr;
  
  printf("%5s\t%6s\n","Celc","Fahr");
  for (upper = 0; (float)upper <= 300.0; upper = (int)((float)upper + 20.0)) {
    printf("%5.0f\t%6.0f\n",(double)(float)upper,(double)((float)upper * 1.8 + 32.0));
  }
  return 0;
}

Assistant:

int main()
{
    float fahr, celcius;
    int lower, upper, step;

    lower = 0;
    upper = 300;
    step = 20;

    celcius = lower;

    printf("%5s\t%6s\n", "Celc", "Fahr");
    while (celcius <= upper) {
        fahr = ((9.0/5.0) * celcius) + 32;
        printf("%5.0f\t%6.0f\n", celcius, fahr);
        celcius = celcius + step;
    }
}